

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createSpecConstantTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  byte bVar7;
  allocator<char> local_c0a;
  allocator<char> local_c09;
  undefined8 local_c08;
  undefined8 uStack_c00;
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  cases;
  string local_bd8;
  vector<int,_std::allocator<int>_> specConstants;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  key_type local_b70;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  undefined8 local_b38;
  undefined8 uStack_b30;
  char decorations2 [82];
  char selectFalseUsingSc [39];
  char selectTrueUsingSc [39];
  char decorations1 [55];
  char addZeroToSc [28];
  char typesAndConstants2 [1402];
  char function2 [442];
  char typesAndConstants1 [134];
  char function1 [505];
  
  bVar7 = 0;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"opspecconstantop","Test the OpSpecConstantOp instruction");
  cases.
  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cases.
  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cases.
  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builtin_strncpy(decorations1,"OpDecorate %sc_0  SpecId 0\nOpDecorate %sc_1  SpecId 1\n",0x37);
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  memcpy(typesAndConstants1,
         "%sc_0      = OpSpecConstant${SC_DEF0}\n%sc_1      = OpSpecConstant${SC_DEF1}\n%sc_op     = OpSpecConstantOp ${SC_RESULT_TYPE} ${SC_OP}\n"
         ,0x86);
  memcpy(function1,
         "%test_code = OpFunction %v4f32 None %v4f32_function\n%param     = OpFunctionParameter %v4f32\n%label     = OpLabel\n%result    = OpVariable %fp_v4f32 Function\n             OpStore %result %param\n%gen       = ${GEN_RESULT}\n%index     = OpIAdd %i32 %gen %c_i32_1\n%loc       = OpAccessChain %fp_f32 %result %index\n%val       = OpLoad %f32 %loc\n%add       = OpFAdd %f32 %val %c_f32_0_5\n             OpStore %loc %add\n%ret       = OpLoad %v4f32 %result\n             OpReturnValue %ret\n             OpFunctionEnd\n"
         ,0x1f9);
  local_b38._0_4_ = 0xff7f7f7f;
  local_b38._4_4_ = 0xff00007f;
  uStack_b30._0_4_ = 0xff007f00;
  uStack_b30._4_4_ = 0xff7f0000;
  local_c08._0_4_ = 0xffff7f7f;
  local_c08._4_4_ = 0xff80007f;
  uStack_c00._0_4_ = 0xff807f00;
  uStack_c00._4_4_ = 0xffff0000;
  builtin_strncpy(addZeroToSc + 0x10,"32_0 %sc_op",0xc);
  builtin_strncpy(addZeroToSc,"OpIAdd %i32 %c_i",0x10);
  builtin_strncpy(selectTrueUsingSc,"OpSelect %i32 %sc_op %c_i32_1 %c_i32_0",0x27);
  builtin_strncpy(selectFalseUsingSc,"OpSelect %i32 %sc_op %c_i32_0 %c_i32_1",0x27);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9d9a;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9dbb;
  typesAndConstants2[0x28] = '\x13';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = -0x14;
  typesAndConstants2[0x2d] = -1;
  typesAndConstants2[0x2e] = -1;
  typesAndConstants2[0x2f] = -1;
  typesAndConstants2[0x38] = -1;
  typesAndConstants2[0x39] = '\x7f';
  typesAndConstants2[0x3a] = '\x7f';
  typesAndConstants2[0x3b] = -1;
  typesAndConstants2[0x3c] = -1;
  typesAndConstants2[0x3d] = '\0';
  typesAndConstants2[0x3e] = '\0';
  typesAndConstants2[0x3f] = -1;
  typesAndConstants2[0x40] = -0x80;
  typesAndConstants2[0x41] = '\x7f';
  typesAndConstants2[0x42] = '\0';
  typesAndConstants2[0x43] = -1;
  typesAndConstants2[0x44] = -0x80;
  typesAndConstants2[0x45] = '\0';
  typesAndConstants2[0x46] = '\x7f';
  typesAndConstants2[0x47] = -1;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9dd2;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9ddd;
  typesAndConstants2[0x28] = '\x13';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x14';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2[0x38] = -1;
  typesAndConstants2[0x39] = '\x7f';
  typesAndConstants2[0x3a] = '\x7f';
  typesAndConstants2[0x3b] = -1;
  typesAndConstants2[0x3c] = -1;
  typesAndConstants2[0x3d] = '\0';
  typesAndConstants2[0x3e] = '\0';
  typesAndConstants2[0x3f] = -1;
  typesAndConstants2[0x40] = -0x80;
  typesAndConstants2[0x41] = '\x7f';
  typesAndConstants2[0x42] = '\0';
  typesAndConstants2[0x43] = -1;
  typesAndConstants2[0x44] = -0x80;
  typesAndConstants2[0x45] = '\0';
  typesAndConstants2[0x46] = '\x7f';
  typesAndConstants2[0x47] = -1;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9de8;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9df3;
  typesAndConstants2[0x28] = -1;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = -1;
  typesAndConstants2[0x2d] = -1;
  typesAndConstants2[0x2e] = -1;
  typesAndConstants2[0x2f] = -1;
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9dfe;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9e09;
  typesAndConstants2[0x28] = -0x7e;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '~';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2[0x38] = -1;
  typesAndConstants2[0x39] = '\x7f';
  typesAndConstants2[0x3a] = '\x7f';
  typesAndConstants2[0x3b] = -1;
  typesAndConstants2[0x3c] = -1;
  typesAndConstants2[0x3d] = '\0';
  typesAndConstants2[0x3e] = '\0';
  typesAndConstants2[0x3f] = -1;
  typesAndConstants2[0x40] = -0x80;
  typesAndConstants2[0x41] = '\x7f';
  typesAndConstants2[0x42] = '\0';
  typesAndConstants2[0x43] = -1;
  typesAndConstants2[0x44] = -0x80;
  typesAndConstants2[0x45] = '\0';
  typesAndConstants2[0x46] = '\x7f';
  typesAndConstants2[0x47] = -1;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9e14;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9e1f;
  typesAndConstants2[0x28] = '~';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '~';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = (long)"opsrem" + 2;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9e35;
  typesAndConstants2[0x28] = '\x03';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x02';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = (long)"opsmod" + 2;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9e4b;
  typesAndConstants2[0x28] = '\x03';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x02';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9e56;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9e61;
  typesAndConstants2[0x28] = -0x17;
  typesAndConstants2[0x29] = '\x03';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = -0xc;
  typesAndConstants2[0x2d] = '\x01';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9e6c;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9e77;
  typesAndConstants2[0x28] = '3';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\r';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9e83;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9e8f;
  typesAndConstants2[0x28] = '\0';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x01';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9e9b;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9ea7;
  typesAndConstants2[0x28] = '.';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '/';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9eb3;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9ebf;
  typesAndConstants2[0x28] = '\x02';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x01';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9ecb;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9ed7;
  typesAndConstants2[0x28] = -4;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '\x02';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2[0x38] = -1;
  typesAndConstants2[0x39] = '\x7f';
  typesAndConstants2[0x3a] = '\x7f';
  typesAndConstants2[0x3b] = -1;
  typesAndConstants2[0x3c] = -1;
  typesAndConstants2[0x3d] = '\0';
  typesAndConstants2[0x3e] = '\0';
  typesAndConstants2[0x3f] = -1;
  typesAndConstants2[0x40] = -0x80;
  typesAndConstants2[0x41] = '\x7f';
  typesAndConstants2[0x42] = '\0';
  typesAndConstants2[0x43] = -1;
  typesAndConstants2[0x44] = -0x80;
  typesAndConstants2[0x45] = '\0';
  typesAndConstants2[0x46] = '\x7f';
  typesAndConstants2[0x47] = -1;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9ee3;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9eef;
  typesAndConstants2[0x28] = '\x01';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9efb;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9f13;
  typesAndConstants2[0x28] = -0x14;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = -10;
  typesAndConstants2[0x2d] = -1;
  typesAndConstants2[0x2e] = -1;
  typesAndConstants2[0x2f] = -1;
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9f1f;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9f2b;
  typesAndConstants2[0x28] = '\n';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x14';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9f37;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9f43;
  typesAndConstants2[0x28] = '\x18';
  typesAndConstants2[0x29] = -4;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '2';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9f4f;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9f5b;
  typesAndConstants2[0x28] = '\n';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x05';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9f67;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9f73;
  typesAndConstants2[0x28] = -10;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = -10;
  typesAndConstants2[0x2d] = -1;
  typesAndConstants2[0x2e] = -1;
  typesAndConstants2[0x2f] = -1;
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9f7f;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9f8b;
  typesAndConstants2[0x28] = '2';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = 'd';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9f97;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9fa3;
  typesAndConstants2[0x28] = '\x18';
  typesAndConstants2[0x29] = -4;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '2';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9faf;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9fbb;
  typesAndConstants2[0x28] = '\n';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\n';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9fc7;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9fd3;
  typesAndConstants2[0x28] = '*';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x18';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6c9fdf;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9feb;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9feb;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6c9ff7;
  typesAndConstants2[0x28] = '\0';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x01';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6ca003;
  typesAndConstants2._8_8_ = anon_var_dwarf_6ca00f;
  typesAndConstants2._16_8_ = anon_var_dwarf_6ca00f;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6ca027;
  typesAndConstants2[0x28] = '\x01';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6ca033;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9feb;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9feb;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6ca03f;
  typesAndConstants2[0x28] = '\0';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x01';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6ca04b;
  typesAndConstants2._8_8_ = anon_var_dwarf_6ca00f;
  typesAndConstants2._16_8_ = anon_var_dwarf_6ca00f;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6ca057;
  typesAndConstants2[0x28] = '\x01';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6ca063;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6ca06f;
  typesAndConstants2[0x28] = -1;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = (long)"multiViewport is supported but geometryShader is not" + 0x31;
  typesAndConstants2._8_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6ca087;
  typesAndConstants2[0x28] = -2;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6ca093;
  typesAndConstants2._8_8_ = anon_var_dwarf_6ca00f;
  typesAndConstants2._16_8_ = anon_var_dwarf_6ca00f;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_6ca09f;
  typesAndConstants2[0x28] = '\x01';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  typesAndConstants2._0_8_ = anon_var_dwarf_6ca0ab;
  typesAndConstants2._8_8_ = anon_var_dwarf_6ca00f;
  typesAndConstants2._16_8_ = anon_var_dwarf_6c9da5;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_6ca0b7;
  typesAndConstants2[0x28] = '\x01';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x01';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._56_8_ = local_c08;
  typesAndConstants2._64_8_ = uStack_c00;
  typesAndConstants2._48_8_ = addZeroToSc;
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::emplace_back<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
            (&cases,(SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  lVar6 = 0x38;
  uVar3 = 0;
  while( true ) {
    if ((ulong)(((long)cases.
                       super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar3) break;
    typesAndConstants2._8_8_ = typesAndConstants2._8_8_ & 0xffffffff00000000;
    typesAndConstants2[0x10] = '\0';
    typesAndConstants2[0x11] = '\0';
    typesAndConstants2[0x12] = '\0';
    typesAndConstants2[0x13] = '\0';
    typesAndConstants2[0x14] = '\0';
    typesAndConstants2[0x15] = '\0';
    typesAndConstants2[0x16] = '\0';
    typesAndConstants2[0x17] = '\0';
    typesAndConstants2._24_8_ = typesAndConstants2 + 8;
    typesAndConstants2[0x28] = '\0';
    typesAndConstants2[0x29] = '\0';
    typesAndConstants2[0x2a] = '\0';
    typesAndConstants2[0x2b] = '\0';
    typesAndConstants2[0x2c] = '\0';
    typesAndConstants2[0x2d] = '\0';
    typesAndConstants2[0x2e] = '\0';
    typesAndConstants2[0x2f] = '\0';
    function2[8] = '\0';
    function2[9] = '\0';
    function2[10] = '\0';
    function2[0xb] = '\0';
    function2[0x10] = '\0';
    function2[0x11] = '\0';
    function2[0x12] = '\0';
    function2[0x13] = '\0';
    function2[0x14] = '\0';
    function2[0x15] = '\0';
    function2[0x16] = '\0';
    function2[0x17] = '\0';
    function2._24_8_ = function2 + 8;
    function2[0x28] = '\0';
    function2[0x29] = '\0';
    function2[0x2a] = '\0';
    function2[0x2b] = '\0';
    function2[0x2c] = '\0';
    function2[0x2d] = '\0';
    function2[0x2e] = '\0';
    function2[0x2f] = '\0';
    specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    typesAndConstants2._32_8_ = typesAndConstants2._24_8_;
    function2._32_8_ = function2._24_8_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)decorations2,"SC_DEF0",(allocator<char> *)&fragments);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)typesAndConstants2,(string *)decorations2);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)decorations2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)decorations2,"SC_DEF1",(allocator<char> *)&fragments);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)typesAndConstants2,(string *)decorations2);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)decorations2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)decorations2,"SC_RESULT_TYPE",(allocator<char> *)&fragments);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)typesAndConstants2,(string *)decorations2);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)decorations2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)decorations2,"SC_OP",(allocator<char> *)&fragments);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)typesAndConstants2,(string *)decorations2);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)decorations2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)decorations2,"GEN_RESULT",(allocator<char> *)&fragments);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)typesAndConstants2,(string *)decorations2);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)decorations2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_bd8,decorations1,&local_c0a)
    ;
    tcu::StringTemplate::StringTemplate((StringTemplate *)&fragments,&local_bd8);
    tcu::StringTemplate::specialize
              ((string *)decorations2,(StringTemplate *)&fragments,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)typesAndConstants2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b70,"decoration",&local_c09)
    ;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)function2,&local_b70);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)decorations2);
    std::__cxx11::string::~string((string *)&local_b70);
    std::__cxx11::string::~string((string *)decorations2);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragments);
    std::__cxx11::string::~string((string *)&local_bd8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd8,typesAndConstants1,&local_c0a);
    tcu::StringTemplate::StringTemplate((StringTemplate *)&fragments,&local_bd8);
    tcu::StringTemplate::specialize
              ((string *)decorations2,(StringTemplate *)&fragments,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)typesAndConstants2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b70,"pre_main",&local_c09);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)function2,&local_b70);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)decorations2);
    std::__cxx11::string::~string((string *)&local_b70);
    std::__cxx11::string::~string((string *)decorations2);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragments);
    std::__cxx11::string::~string((string *)&local_bd8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_bd8,function1,&local_c0a);
    tcu::StringTemplate::StringTemplate((StringTemplate *)&fragments,&local_bd8);
    tcu::StringTemplate::specialize
              ((string *)decorations2,(StringTemplate *)&fragments,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)typesAndConstants2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b70,"testfun",&local_c09);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)function2,&local_b70);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)decorations2);
    std::__cxx11::string::~string((string *)&local_b70);
    std::__cxx11::string::~string((string *)decorations2);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragments);
    std::__cxx11::string::~string((string *)&local_bd8);
    std::vector<int,_std::allocator<int>_>::push_back
              (&specConstants,
               (value_type_conflict4 *)
               ((long)((cases.
                        super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                        ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -0x12) + lVar6)
              );
    std::vector<int,_std::allocator<int>_>::push_back
              (&specConstants,
               (value_type_conflict4 *)
               ((long)((cases.
                        super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                        ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -0x11) + lVar6)
              );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)decorations2,
               *(char **)((long)((cases.
                                  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -0x1c
                                ) + lVar6),(allocator<char> *)&local_bd8);
    fragments._M_t._M_impl._0_8_ = &fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
         0xffffffffffffff00);
    createTestsForAllStages
              ((string *)decorations2,(RGBA (*) [4])&local_b38,
               (RGBA (*) [4])
               ((long)&((SpecConstantTwoIntGraphicsCase *)
                       ((cases.
                         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                         ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -0xe))->
                       caseName + lVar6),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)function2,
               (vector<int,_std::allocator<int>_> *)
               &specConstants.super__Vector_base<int,_std::allocator<int>_>,
               group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr,QP_TEST_RESULT_FAIL,(string *)&fragments);
    std::__cxx11::string::~string((string *)&fragments);
    std::__cxx11::string::~string((string *)decorations2);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&specConstants.super__Vector_base<int,_std::allocator<int>_>);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)function2);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)typesAndConstants2);
    uVar3 = uVar3 + 1;
    lVar6 = lVar6 + 0x48;
  }
  pcVar4 = "OpDecorate %sc_0  SpecId 0\nOpDecorate %sc_1  SpecId 1\nOpDecorate %sc_2  SpecId 2\n";
  pcVar5 = decorations2;
  for (lVar6 = 0x52; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pcVar5 = *pcVar4;
    pcVar4 = pcVar4 + (ulong)bVar7 * -2 + 1;
    pcVar5 = pcVar5 + (ulong)bVar7 * -2 + 1;
  }
  memcpy(typesAndConstants2,
         "%v3i32       = OpTypeVector %i32 3\n%vec3_0      = OpConstantComposite %v3i32 %c_i32_0 %c_i32_0 %c_i32_0\n%vec3_undef  = OpUndef %v3i32\n%sc_0        = OpSpecConstant %i32 0\n%sc_1        = OpSpecConstant %i32 0\n%sc_2        = OpSpecConstant %i32 0\n%sc_vec3_0   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_0        %vec3_0      0\n%sc_vec3_1   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_1        %vec3_0      1\n%sc_vec3_2   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_2        %vec3_0      2\n%sc_vec3_0_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0   %vec3_undef  0          0xFFFFFFFF 2\n%sc_vec3_1_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_1   %vec3_undef  0xFFFFFFFF 1          0\n%sc_vec3_2_s = OpSpecConstantOp %v3i32 VectorShuffle    %vec3_undef  %sc_vec3_2   5          0xFFFFFFFF 5\n%sc_vec3_01  = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0_s %sc_vec3_1_s 1 0 4\n%sc_vec3_012 = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_01  %sc_vec3_2_s 5 1 2\n%sc_ext_0    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              0\n%sc_ext_1    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              1\n%sc_ext_2    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              2\n%sc_sub      = OpSpecConstantOp %i32   ISub             %sc_ext_0    %sc_ext_1\n%sc_final    = OpSpecConstantOp %i32   IMul             %sc_sub      %sc_ext_2\n"
         ,0x57a);
  memcpy(function2,
         "%test_code = OpFunction %v4f32 None %v4f32_function\n%param     = OpFunctionParameter %v4f32\n%label     = OpLabel\n%result    = OpVariable %fp_v4f32 Function\n             OpStore %result %param\n%loc       = OpAccessChain %fp_f32 %result %sc_final\n%val       = OpLoad %f32 %loc\n%add       = OpFAdd %f32 %val %c_f32_0_5\n             OpStore %loc %add\n%ret       = OpLoad %v4f32 %result\n             OpReturnValue %ret\n             OpFunctionEnd\n"
         ,0x1ba);
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       fragments._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bd8,"decoration",(allocator<char> *)&local_b70);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,&local_bd8);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bd8,"pre_main",(allocator<char> *)&local_b70);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,&local_bd8);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bd8,"testfun",(allocator<char> *)&local_b70);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,&local_bd8);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_bd8);
  local_bd8._M_dataplus._M_p._0_4_ = 0xddd5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&specConstants,(int *)&local_bd8);
  local_bd8._M_dataplus._M_p._0_4_ = 0xfffffffe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&specConstants,(int *)&local_bd8);
  local_bd8._M_dataplus._M_p._0_4_ = 0xddd4;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&specConstants,(int *)&local_bd8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bd8,"vector_related",&local_c0a);
  local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
  local_b70._M_string_length = 0;
  local_b70.field_2._M_local_buf[0] = '\0';
  createTestsForAllStages
            (&local_bd8,(RGBA (*) [4])&local_b38,(RGBA (*) [4])&local_c08,&fragments,&specConstants,
             group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr,QP_TEST_RESULT_FAIL,&local_b70);
  std::__cxx11::string::~string((string *)&local_b70);
  std::__cxx11::string::~string((string *)&local_bd8);
  pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&specConstants.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments._M_t);
  std::
  _Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::~_Vector_base(&cases.
                   super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                 );
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createSpecConstantTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group				(new tcu::TestCaseGroup(testCtx, "opspecconstantop", "Test the OpSpecConstantOp instruction"));
	vector<SpecConstantTwoIntGraphicsCase>	cases;
	RGBA							inputColors[4];
	RGBA							outputColors0[4];
	RGBA							outputColors1[4];
	RGBA							outputColors2[4];

	const char	decorations1[]			=
		"OpDecorate %sc_0  SpecId 0\n"
		"OpDecorate %sc_1  SpecId 1\n";

	const char	typesAndConstants1[]	=
		"%sc_0      = OpSpecConstant${SC_DEF0}\n"
		"%sc_1      = OpSpecConstant${SC_DEF1}\n"
		"%sc_op     = OpSpecConstantOp ${SC_RESULT_TYPE} ${SC_OP}\n";

	const char	function1[]				=
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param     = OpFunctionParameter %v4f32\n"
		"%label     = OpLabel\n"
		"%result    = OpVariable %fp_v4f32 Function\n"
		"             OpStore %result %param\n"
		"%gen       = ${GEN_RESULT}\n"
		"%index     = OpIAdd %i32 %gen %c_i32_1\n"
		"%loc       = OpAccessChain %fp_f32 %result %index\n"
		"%val       = OpLoad %f32 %loc\n"
		"%add       = OpFAdd %f32 %val %c_f32_0_5\n"
		"             OpStore %loc %add\n"
		"%ret       = OpLoad %v4f32 %result\n"
		"             OpReturnValue %ret\n"
		"             OpFunctionEnd\n";

	inputColors[0] = RGBA(127, 127, 127, 255);
	inputColors[1] = RGBA(127, 0,   0,   255);
	inputColors[2] = RGBA(0,   127, 0,   255);
	inputColors[3] = RGBA(0,   0,   127, 255);

	// Derived from inputColors[x] by adding 128 to inputColors[x][0].
	outputColors0[0] = RGBA(255, 127, 127, 255);
	outputColors0[1] = RGBA(255, 0,   0,   255);
	outputColors0[2] = RGBA(128, 127, 0,   255);
	outputColors0[3] = RGBA(128, 0,   127, 255);

	// Derived from inputColors[x] by adding 128 to inputColors[x][1].
	outputColors1[0] = RGBA(127, 255, 127, 255);
	outputColors1[1] = RGBA(127, 128, 0,   255);
	outputColors1[2] = RGBA(0,   255, 0,   255);
	outputColors1[3] = RGBA(0,   128, 127, 255);

	// Derived from inputColors[x] by adding 128 to inputColors[x][2].
	outputColors2[0] = RGBA(127, 127, 255, 255);
	outputColors2[1] = RGBA(127, 0,   128, 255);
	outputColors2[2] = RGBA(0,   127, 128, 255);
	outputColors2[3] = RGBA(0,   0,   255, 255);

	const char addZeroToSc[]		= "OpIAdd %i32 %c_i32_0 %sc_op";
	const char selectTrueUsingSc[]	= "OpSelect %i32 %sc_op %c_i32_1 %c_i32_0";
	const char selectFalseUsingSc[]	= "OpSelect %i32 %sc_op %c_i32_0 %c_i32_1";

	cases.push_back(SpecConstantTwoIntGraphicsCase("iadd",					" %i32 0",		" %i32 0",		"%i32",		"IAdd                 %sc_0 %sc_1",				19,		-20,	addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("isub",					" %i32 0",		" %i32 0",		"%i32",		"ISub                 %sc_0 %sc_1",				19,		20,		addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("imul",					" %i32 0",		" %i32 0",		"%i32",		"IMul                 %sc_0 %sc_1",				-1,		-1,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("sdiv",					" %i32 0",		" %i32 0",		"%i32",		"SDiv                 %sc_0 %sc_1",				-126,	126,	addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("udiv",					" %i32 0",		" %i32 0",		"%i32",		"UDiv                 %sc_0 %sc_1",				126,	126,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("srem",					" %i32 0",		" %i32 0",		"%i32",		"SRem                 %sc_0 %sc_1",				3,		2,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("smod",					" %i32 0",		" %i32 0",		"%i32",		"SMod                 %sc_0 %sc_1",				3,		2,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("umod",					" %i32 0",		" %i32 0",		"%i32",		"UMod                 %sc_0 %sc_1",				1001,	500,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("bitwiseand",			" %i32 0",		" %i32 0",		"%i32",		"BitwiseAnd           %sc_0 %sc_1",				0x33,	0x0d,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("bitwiseor",				" %i32 0",		" %i32 0",		"%i32",		"BitwiseOr            %sc_0 %sc_1",				0,		1,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("bitwisexor",			" %i32 0",		" %i32 0",		"%i32",		"BitwiseXor           %sc_0 %sc_1",				0x2e,	0x2f,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("shiftrightlogical",		" %i32 0",		" %i32 0",		"%i32",		"ShiftRightLogical    %sc_0 %sc_1",				2,		1,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("shiftrightarithmetic",	" %i32 0",		" %i32 0",		"%i32",		"ShiftRightArithmetic %sc_0 %sc_1",				-4,		2,		addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("shiftleftlogical",		" %i32 0",		" %i32 0",		"%i32",		"ShiftLeftLogical     %sc_0 %sc_1",				1,		0,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("slessthan",				" %i32 0",		" %i32 0",		"%bool",	"SLessThan            %sc_0 %sc_1",				-20,	-10,	selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ulessthan",				" %i32 0",		" %i32 0",		"%bool",	"ULessThan            %sc_0 %sc_1",				10,		20,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("sgreaterthan",			" %i32 0",		" %i32 0",		"%bool",	"SGreaterThan         %sc_0 %sc_1",				-1000,	50,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ugreaterthan",			" %i32 0",		" %i32 0",		"%bool",	"UGreaterThan         %sc_0 %sc_1",				10,		5,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("slessthanequal",		" %i32 0",		" %i32 0",		"%bool",	"SLessThanEqual       %sc_0 %sc_1",				-10,	-10,	selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ulessthanequal",		" %i32 0",		" %i32 0",		"%bool",	"ULessThanEqual       %sc_0 %sc_1",				50,		100,	selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("sgreaterthanequal",		" %i32 0",		" %i32 0",		"%bool",	"SGreaterThanEqual    %sc_0 %sc_1",				-1000,	50,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ugreaterthanequal",		" %i32 0",		" %i32 0",		"%bool",	"UGreaterThanEqual    %sc_0 %sc_1",				10,		10,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("iequal",				" %i32 0",		" %i32 0",		"%bool",	"IEqual               %sc_0 %sc_1",				42,		24,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicaland",			"True %bool",	"True %bool",	"%bool",	"LogicalAnd           %sc_0 %sc_1",				0,		1,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalor",				"False %bool",	"False %bool",	"%bool",	"LogicalOr            %sc_0 %sc_1",				1,		0,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalequal",			"True %bool",	"True %bool",	"%bool",	"LogicalEqual         %sc_0 %sc_1",				0,		1,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalnotequal",		"False %bool",	"False %bool",	"%bool",	"LogicalNotEqual      %sc_0 %sc_1",				1,		0,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("snegate",				" %i32 0",		" %i32 0",		"%i32",		"SNegate              %sc_0",					-1,		0,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("not",					" %i32 0",		" %i32 0",		"%i32",		"Not                  %sc_0",					-2,		0,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalnot",			"False %bool",	"False %bool",	"%bool",	"LogicalNot           %sc_0",					1,		0,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("select",				"False %bool",	" %i32 0",		"%i32",		"Select               %sc_0 %sc_1 %c_i32_0",	1,		1,		addZeroToSc,		outputColors2));
	// OpSConvert, OpFConvert: these two instructions involve ints/floats of different bitwidths.
	// \todo[2015-12-1 antiagainst] OpQuantizeToF16

	for (size_t caseNdx = 0; caseNdx < cases.size(); ++caseNdx)
	{
		map<string, string>	specializations;
		map<string, string>	fragments;
		vector<deInt32>		specConstants;

		specializations["SC_DEF0"]			= cases[caseNdx].scDefinition0;
		specializations["SC_DEF1"]			= cases[caseNdx].scDefinition1;
		specializations["SC_RESULT_TYPE"]	= cases[caseNdx].scResultType;
		specializations["SC_OP"]			= cases[caseNdx].scOperation;
		specializations["GEN_RESULT"]		= cases[caseNdx].resultOperation;

		fragments["decoration"]				= tcu::StringTemplate(decorations1).specialize(specializations);
		fragments["pre_main"]				= tcu::StringTemplate(typesAndConstants1).specialize(specializations);
		fragments["testfun"]				= tcu::StringTemplate(function1).specialize(specializations);

		specConstants.push_back(cases[caseNdx].scActualValue0);
		specConstants.push_back(cases[caseNdx].scActualValue1);

		createTestsForAllStages(cases[caseNdx].caseName, inputColors, cases[caseNdx].expectedColors, fragments, specConstants, group.get());
	}

	const char	decorations2[]			=
		"OpDecorate %sc_0  SpecId 0\n"
		"OpDecorate %sc_1  SpecId 1\n"
		"OpDecorate %sc_2  SpecId 2\n";

	const char	typesAndConstants2[]	=
		"%v3i32       = OpTypeVector %i32 3\n"
		"%vec3_0      = OpConstantComposite %v3i32 %c_i32_0 %c_i32_0 %c_i32_0\n"
		"%vec3_undef  = OpUndef %v3i32\n"

		"%sc_0        = OpSpecConstant %i32 0\n"
		"%sc_1        = OpSpecConstant %i32 0\n"
		"%sc_2        = OpSpecConstant %i32 0\n"
		"%sc_vec3_0   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_0        %vec3_0      0\n"							// (sc_0, 0,    0)
		"%sc_vec3_1   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_1        %vec3_0      1\n"							// (0,    sc_1, 0)
		"%sc_vec3_2   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_2        %vec3_0      2\n"							// (0,    0,    sc_2)
		"%sc_vec3_0_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0   %vec3_undef  0          0xFFFFFFFF 2\n"	// (sc_0, ???,  0)
		"%sc_vec3_1_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_1   %vec3_undef  0xFFFFFFFF 1          0\n"	// (???,  sc_1, 0)
		"%sc_vec3_2_s = OpSpecConstantOp %v3i32 VectorShuffle    %vec3_undef  %sc_vec3_2   5          0xFFFFFFFF 5\n"	// (sc_2, ???,  sc_2)
		"%sc_vec3_01  = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0_s %sc_vec3_1_s 1 0 4\n"						// (0,    sc_0, sc_1)
		"%sc_vec3_012 = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_01  %sc_vec3_2_s 5 1 2\n"						// (sc_2, sc_0, sc_1)
		"%sc_ext_0    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              0\n"							// sc_2
		"%sc_ext_1    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              1\n"							// sc_0
		"%sc_ext_2    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              2\n"							// sc_1
		"%sc_sub      = OpSpecConstantOp %i32   ISub             %sc_ext_0    %sc_ext_1\n"								// (sc_2 - sc_0)
		"%sc_final    = OpSpecConstantOp %i32   IMul             %sc_sub      %sc_ext_2\n";								// (sc_2 - sc_0) * sc_1

	const char	function2[]				=
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param     = OpFunctionParameter %v4f32\n"
		"%label     = OpLabel\n"
		"%result    = OpVariable %fp_v4f32 Function\n"
		"             OpStore %result %param\n"
		"%loc       = OpAccessChain %fp_f32 %result %sc_final\n"
		"%val       = OpLoad %f32 %loc\n"
		"%add       = OpFAdd %f32 %val %c_f32_0_5\n"
		"             OpStore %loc %add\n"
		"%ret       = OpLoad %v4f32 %result\n"
		"             OpReturnValue %ret\n"
		"             OpFunctionEnd\n";

	map<string, string>	fragments;
	vector<deInt32>		specConstants;

	fragments["decoration"]	= decorations2;
	fragments["pre_main"]	= typesAndConstants2;
	fragments["testfun"]	= function2;

	specConstants.push_back(56789);
	specConstants.push_back(-2);
	specConstants.push_back(56788);

	createTestsForAllStages("vector_related", inputColors, outputColors2, fragments, specConstants, group.get());

	return group.release();
}